

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::Array2D<float>::Array2D<float_const*,void>
          (Array2D<float> *this,float *first,float *last,int nx,int ny,allocator_type allocator)

{
  int iVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  undefined4 extraout_var;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  float *__s;
  int iVar6;
  
  uVar3 = 0;
  TVar2.x = nx >> 0x1f & nx;
  uVar4 = 0;
  if (0 < nx) {
    uVar4 = (ulong)(uint)nx;
  }
  if (0 < ny) {
    uVar3 = (ulong)(uint)ny;
  }
  TVar2.y = ny >> 0x1f & ny;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar2;
  iVar1 = -nx;
  if (0 < nx) {
    iVar1 = nx;
  }
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)(uVar4 | uVar3 << 0x20);
  (this->allocator).memoryResource = allocator.memoryResource;
  iVar6 = -ny;
  if (0 < ny) {
    iVar6 = ny;
  }
  uVar5 = iVar6 * iVar1;
  iVar1 = (*(allocator.memoryResource)->_vptr_memory_resource[2])
                    (allocator.memoryResource,(ulong)uVar5 * 4,4);
  __s = (float *)CONCAT44(extraout_var,iVar1);
  this->values = __s;
  if (uVar5 != 0) {
    memset(__s,0,(ulong)uVar5 << 2);
  }
  if ((long)last - (long)first != 0) {
    memmove(__s,first,(long)last - (long)first);
    return;
  }
  return;
}

Assistant:

Array2D(InputIt first, InputIt last, int nx, int ny, allocator_type allocator = {})
        : Array2D({{0, 0}, {nx, ny}}, allocator) {
        std::copy(first, last, begin());
    }